

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O0

int __thiscall
DIS::ElectromagneticEmissionBeamData::getMarshalledSize(ElectromagneticEmissionBeamData *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined1 local_50 [8];
  TrackJamData listElement;
  unsigned_long_long idx;
  int marshalSize;
  ElectromagneticEmissionBeamData *this_local;
  
  iVar2 = EEFundamentalParameterData::getMarshalledSize(&this->_fundamentalParameterData);
  iVar3 = BeamData::getMarshalledSize(&this->_beamData);
  iVar4 = JammingTechnique::getMarshalledSize(&this->_jammingTechnique);
  idx._4_4_ = iVar2 + iVar3 + 8 + iVar4;
  listElement._emitterNumber = '\0';
  listElement._beamNumber = '\0';
  listElement._42_6_ = 0;
  while( true ) {
    uVar1 = listElement._40_8_;
    sVar5 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::size
                      (&this->_trackJamTargets);
    if (sVar5 <= (ulong)uVar1) break;
    pvVar6 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::operator[]
                       (&this->_trackJamTargets,listElement._40_8_);
    TrackJamData::TrackJamData((TrackJamData *)local_50,pvVar6);
    iVar2 = TrackJamData::getMarshalledSize((TrackJamData *)local_50);
    idx._4_4_ = idx._4_4_ + iVar2;
    TrackJamData::~TrackJamData((TrackJamData *)local_50);
    listElement._40_8_ = listElement._40_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int ElectromagneticEmissionBeamData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _beamDataLength
   marshalSize = marshalSize + 1;  // _beamIDNumber
   marshalSize = marshalSize + 2;  // _beamParameterIndex
   marshalSize = marshalSize + _fundamentalParameterData.getMarshalledSize();  // _fundamentalParameterData
   marshalSize = marshalSize + _beamData.getMarshalledSize();  // _beamData
   marshalSize = marshalSize + 1;  // _beamFunction
   marshalSize = marshalSize + 1;  // _numberOfTrackJamTargets
   marshalSize = marshalSize + 1;  // _highDensityTrackJam
   marshalSize = marshalSize + 1;  // _beamStatus
   marshalSize = marshalSize + _jammingTechnique.getMarshalledSize();  // _jammingTechnique

   for(unsigned long long idx=0; idx < _trackJamTargets.size(); idx++)
   {
        TrackJamData listElement = _trackJamTargets[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}